

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

int __thiscall
sznet::net::TcpClient::connect(TcpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ulong __n;
  int extraout_EAX;
  int iVar1;
  SourceFile file;
  Logger local_1010;
  string local_40;
  
  if (g_logLevel < 3) {
    file._8_8_ = 0xd;
    file.m_data = "TcpClient.cpp";
    Logger::Logger(&local_1010,file,0x62);
    iVar1 = (int)&local_1010 + 0xfb0;
    if (0x13 < (uint)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"TcpClient::connect[",0x13);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0x13;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1010.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if (0x12 < (uint)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"] - connecting to ",0x12);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0x12;
    }
    InetAddress::toIpPort_abi_cxx11_
              (&local_40,
               &((this->m_connector).
                 super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_serverAddr);
    if (local_40._M_string_length <
        (ulong)(long)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1010.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1010.m_impl.m_stream.m_buffer.m_cur =
           local_1010.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    Logger::~Logger(&local_1010);
  }
  this->m_connect = true;
  Connector::start((this->m_connector).
                   super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return extraout_EAX;
}

Assistant:

void TcpClient::connect()
{
	// FIXME: check state
	LOG_INFO << "TcpClient::connect[" << m_name << "] - connecting to "
			<< m_connector->serverAddress().toIpPort();
	m_connect = true;
	m_connector->start();
}